

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::remap_raytracing_pipeline_handle
          (Impl *this,VkPipeline pipeline,VkPipeline *out_pipeline)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  _Hash_node_base *p_Var4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  long *in_FS_OFFSET;
  
  uVar1 = (this->raytracing_pipeline_to_hash)._M_h._M_bucket_count;
  uVar3 = (ulong)pipeline % uVar1;
  p_Var5 = (this->raytracing_pipeline_to_hash)._M_h._M_buckets[uVar3];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var4 = p_Var5->_M_nxt, p_Var6 = p_Var5, (VkPipeline)p_Var5->_M_nxt[1]._M_nxt != pipeline)) {
    while (p_Var5 = p_Var4, p_Var4 = p_Var5->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var4[1]._M_nxt % uVar1 != uVar3) ||
         (p_Var6 = p_Var5, (VkPipeline)p_Var4[1]._M_nxt == pipeline)) goto LAB_0016c556;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_0016c556:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var4 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var4 = p_Var6->_M_nxt;
  }
  if (p_Var4 == (_Hash_node_base *)0x0) {
    if ((*(int *)(*in_FS_OFFSET + -0x20) < 2) &&
       (bVar2 = Internal::log_thread_callback
                          (LOG_DEFAULT,
                           "Cannot find raytracing pipeline in hashmap.\nObject has either not been recorded, or it was not supported by Fossilize.\n"
                          ), !bVar2)) {
      remap_raytracing_pipeline_handle();
    }
  }
  else {
    *out_pipeline = (VkPipeline)p_Var4[2]._M_nxt;
  }
  return p_Var4 != (_Hash_node_base *)0x0;
}

Assistant:

bool StateRecorder::Impl::remap_raytracing_pipeline_handle(VkPipeline pipeline, VkPipeline *out_pipeline) const
{
	auto itr = raytracing_pipeline_to_hash.find(pipeline);
	if (itr == end(raytracing_pipeline_to_hash))
	{
		LOGW_LEVEL("Cannot find raytracing pipeline in hashmap.\n"
		           "Object has either not been recorded, or it was not supported by Fossilize.\n");
		return false;
	}
	else
	{
		*out_pipeline = api_object_cast<VkPipeline>(uint64_t(itr->second));
		return true;
	}
}